

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpUtils.h
# Opt level: O2

int sendsimplehttpgetreq(SOCKET sock,char *url)

{
  char *__s;
  int iVar1;
  size_t sVar2;
  char *__s_00;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  
  sVar2 = strlen(url);
  __s_00 = (char *)calloc(sVar2 + 0x100,1);
  if (__s_00 == (char *)0x0) {
    iVar1 = 6;
  }
  else {
    __s = url + 7;
    pcVar3 = strchr(__s,0x2f);
    pcVar4 = url + sVar2;
    if (pcVar3 != (char *)0x0) {
      pcVar4 = pcVar3;
    }
    iVar1 = (int)pcVar4 - (int)url;
    uVar5 = iVar1 - 7;
    if ((int)uVar5 < 1) {
      iVar1 = 3;
    }
    else {
      pcVar4 = (char *)calloc((ulong)(iVar1 - 6),1);
      if (pcVar4 == (char *)0x0) {
        iVar1 = 6;
      }
      else {
        memcpy(pcVar4,__s,(ulong)uVar5);
        sVar2 = strlen(pcVar4);
        sprintf(__s_00,"GET %s HTTP/1.1\r\nHost: %s\r\n\r\n",__s + sVar2,pcVar4);
        free(pcVar4);
        sVar2 = strlen(__s_00);
        iVar1 = sendall(sock,__s_00,(int)sVar2);
      }
    }
    free(__s_00);
  }
  return iVar1;
}

Assistant:

inline int sendsimplehttpgetreq(SOCKET sock, char* url)
{
	int ret = EXIT_FAILURE;
	char* sendbuf = NULL;
	int sendbuflen = 0;
	char* address = NULL;
	int count = 0;
	char* ptr = NULL;

	sendbuf = (char*)calloc(strlen(url)+256, 1);
	if (sendbuf == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		return EXIT_OUT_OF_MEMORY;
	}

	ptr = strchr(url+strlen("http://"), '/');
	if (ptr == NULL) ptr = url+strlen(url);
	count = (int)(ptr-url-strlen("http://"));
	if (count <= 0)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_INVALID_PARAMETER],
			(int)sock, url));
		free(sendbuf);
		return EXIT_INVALID_PARAMETER;
	}

	address = (char*)calloc(count+1, 1);
	if (address == NULL)
	{
		PRINT_DEBUG_ERROR_OSNET(("sendhttpgetreq error (%s) : %s(sock=%d, url=%s)\n",
			strtime_m(),
			szOSUtilsErrMsgs[EXIT_OUT_OF_MEMORY],
			(int)sock, url));
		free(sendbuf);
		return EXIT_OUT_OF_MEMORY;
	}

	memcpy(address, url+strlen("http://"), count);
	sprintf(sendbuf,
		"GET %s HTTP/1.1\r\n"
		"Host: %s\r\n"
//		"Accept: text/html\r\n"
		"\r\n",
		url+strlen("http://")+strlen(address), address);
	free(address);
	sendbuflen = (int)strlen(sendbuf);
	ret = sendall(sock, sendbuf, sendbuflen);
	if (ret != EXIT_SUCCESS)
	{
		free(sendbuf);
		return ret;
	}

	free(sendbuf);

	return EXIT_SUCCESS;
}